

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

optional<double> assign_d(string_view value,double mindef,double maxdef)

{
  bool bVar1;
  double *pdVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  optional<double> oVar4;
  _Storage<double,_true> local_48;
  optional<double> result;
  double maxdef_local;
  double mindef_local;
  string_view value_local;
  undefined1 local_10;
  
  value_local._M_len = (size_t)value._M_str;
  result.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = maxdef;
  oVar4 = to_double(value);
  local_48 = oVar4.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
  result.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._0_1_ =
       oVar4.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged;
  bVar1 = std::optional<double>::has_value((optional<double> *)&local_48);
  if (((!bVar1) ||
      (pdVar2 = std::optional<double>::operator*((optional<double> *)&local_48), *pdVar2 < mindef))
     || (pdVar2 = std::optional<double>::operator*((optional<double> *)&local_48),
        (double)result.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._8_8_ < *pdVar2)) {
    std::optional<double>::optional((optional<double> *)&value_local._M_str);
    uVar3 = extraout_RAX_00;
  }
  else {
    pdVar2 = std::optional<double>::operator*((optional<double> *)&local_48);
    std::optional<double>::optional<double_&,_true>((optional<double> *)&value_local._M_str,pdVar2);
    uVar3 = extraout_RAX;
  }
  oVar4.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)local_10;
  oVar4.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)value_local._M_str;
  return (optional<double>)
         oVar4.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

constexpr static std::optional<double>
assign_d(std::string_view value, double mindef, double maxdef)
{
    auto result = ::to_double(value);

    if (result.has_value() && *result >= mindef && *result <= maxdef)
        return *result;
    else
        return std::nullopt;
}